

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_net.c
# Opt level: O3

uint sockaddr_get_port(sockaddr *sa)

{
  if ((sa->sa_family | 8) == 10) {
    return (uint)(ushort)(*(ushort *)sa->sa_data << 8 | *(ushort *)sa->sa_data >> 8);
  }
  return 0;
}

Assistant:

unsigned int sockaddr_get_port(const struct sockaddr *sa)
{
    if (sa->sa_family == AF_INET6)
    {
        struct sockaddr_in6 *sa6 = (struct sockaddr_in6 *)sa;
        return ntohs(sa6->sin6_port);
    }
    else if (sa->sa_family == AF_INET)
    {
        struct sockaddr_in *sa4 = (struct sockaddr_in *)sa;
        return ntohs(sa4->sin_port);
    }
    else
        return 0;
}